

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_math.cpp
# Opt level: O2

void __thiscall strain_example1_Test::TestBody(strain_example1_Test *this)

{
  measurement *pmVar1;
  uint64_t in_RCX;
  string *__return_storage_ptr__;
  char *pcVar2;
  AssertionResult gtest_ar_1;
  AssertHelper local_80;
  string local_78;
  measurement distortion;
  measurement strain;
  measurement length;
  measurement deltaLength;
  
  deltaLength.value_ = 1e-05;
  deltaLength.units_.multiplier_ = 1.0;
  deltaLength.units_.base_units_ = (unit_data)0x1;
  length.value_ = 1.0;
  length.units_.multiplier_ = 1.0;
  length.units_.base_units_ = (unit_data)0x1;
  strain = units::measurement::operator/(&deltaLength,&length);
  pmVar1 = (measurement *)units::getDefaultFlags();
  __return_storage_ptr__ = &local_78;
  units::to_string_abi_cxx11_(__return_storage_ptr__,(units *)&strain,pmVar1,in_RCX);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[6]>
            ((internal *)&distortion,"to_string(strain)","\"1e-05\"",__return_storage_ptr__,
             (char (*) [6])"1e-05");
  std::__cxx11::string::~string((string *)&local_78);
  if (distortion.value_._0_1_ == '\0') {
    testing::Message::Message((Message *)&local_78);
    if (distortion.units_ == (unit)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)distortion.units_;
    }
    __return_storage_ptr__ = (string *)0x11e;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_math.cpp",
               0x11e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    if ((long *)local_78._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_78._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&distortion.units_);
  local_78._M_dataplus._M_p = &DAT_4024000000000000;
  local_78._M_string_length = 0x13e9c0ebf;
  distortion = units::measurement::operator*(&strain,(measurement *)&local_78);
  pmVar1 = (measurement *)units::getDefaultFlags();
  units::to_string_abi_cxx11_
            (&local_78,(units *)&distortion,pmVar1,(uint64_t)__return_storage_ptr__);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[10]>
            ((internal *)&gtest_ar_1,"to_string(distortion)","\"0.0001 ft\"",&local_78,
             (char (*) [10])"0.0001 ft");
  std::__cxx11::string::~string((string *)&local_78);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&local_78);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar_1.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_math.cpp",
               0x122,pcVar2);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if ((long *)local_78._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_78._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_1.message_);
  return;
}

Assistant:

TEST(strain, example1)
{
    measurement deltaLength = 0.00001 * m;
    measurement length = 1 * m;

    auto strain = deltaLength / length;

    EXPECT_EQ(to_string(strain), "1e-05");

    // applied to a 10 ft bar
    auto distortion = strain * (10 * ft);
    EXPECT_EQ(to_string(distortion), "0.0001 ft");
}